

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FallbackSolverWrapper.cpp
# Opt level: O3

Status __thiscall
SAT::FallbackSolverWrapper::solve(FallbackSolverWrapper *this,uint conflictCountLimit)

{
  SATSolver *pSVar1;
  Status SVar2;
  bool bVar3;
  
  SVar2 = (*((this->_inner)._obj)->_vptr_SATSolver[5])();
  bVar3 = SVar2 == UNKNOWN;
  if (bVar3) {
    pSVar1 = (this->_fallback)._obj;
    SVar2 = (*pSVar1->_vptr_SATSolver[5])(pSVar1,conflictCountLimit);
    *(int *)(DAT_00b521c0 + 0x21c) = *(int *)(DAT_00b521c0 + 0x21c) + 1;
  }
  this->_usingFallback = bVar3;
  return SVar2;
}

Assistant:

SATSolver::Status FallbackSolverWrapper::solve(unsigned conflictCountLimit)
{
  // Currently always run the _inner solver to see if we can use it
  Status status = _inner->solve(conflictCountLimit);

  // Check if we need to use _fallback
  if(status == Status::UNKNOWN){
    status = _fallback->solve(conflictCountLimit);
    _usingFallback = true;
    ASS(status != Status::UNKNOWN);
    env.statistics->smtFallbacks++;
  } 
  else{
    _usingFallback = false;
  }
  return status;
}